

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTestCase.cpp
# Opt level: O2

void __thiscall
SuiteUtilityTests::TestfileExists_FileDoesNotExist::RunImpl(TestfileExists_FileDoesNotExist *this)

{
  TestResults *this_00;
  char cVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  string unknownFile;
  TestDetails TStack_48;
  char *local_28 [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"unknownfile.txt",(allocator<char> *)&TStack_48);
  cVar1 = FIX::file_exists(local_28[0]);
  if (cVar1 != '\0') {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_48,*ppTVar3,0xc4);
    UnitTest::TestResults::OnTestFailure(this_00,&TStack_48,"!file_exists(unknownFile.c_str())");
  }
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(fileExists_FileDoesNotExist)
{
  std::string unknownFile = "unknownfile.txt";
  CHECK(!file_exists(unknownFile.c_str()));
}